

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O1

void __thiscall
WavingSketch<8U,_16U,_4U>::Init(WavingSketch<8U,_16U,_4U> *this,Data<4U> *item,uint time)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  uint position;
  uint uVar4;
  uint uVar5;
  uint8_t *data;
  bool bVar6;
  
  if (this->record < time) {
    this->record = time;
    memset(this->bitset->bitset,0,(ulong)(this->bitset->LENGTH >> 3) + 1);
  }
  if (this->HASH_NUM != 0) {
    uVar5 = 0;
    bVar6 = true;
    do {
      uVar4 = (*(int *)item->str * 0x16a88000 | (uint)(*(int *)item->str * -0x3361d2af) >> 0x11) *
              0x1b873593 ^ uVar5;
      uVar4 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64;
      uVar4 = (uVar4 >> 0x10 ^ uVar4 ^ 4) * -0x7a143595;
      uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
      uVar3 = (ulong)(uVar4 >> 0x10 ^ uVar4) % (ulong)this->LENGTH;
      puVar2 = this->bitset->bitset;
      bVar1 = puVar2[uVar3 >> 3];
      if ((bVar1 >> ((uint)uVar3 & 7) & 1) == 0) {
        puVar2[uVar3 >> 3] = (byte)(1 << ((byte)uVar3 & 7)) | bVar1;
        bVar6 = false;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->HASH_NUM);
    if (!bVar6) {
      (**(this->super_Abstract<4U>)._vptr_Abstract)(this,item);
      return;
    }
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}